

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O2

void __thiscall Executor::handleIf(Executor *this,FunctionCallNode *node)

{
  long *plVar1;
  Value *pVVar2;
  int iVar3;
  undefined4 extraout_var;
  mapped_type *__rhs;
  long *plVar4;
  NumberValueAnalyser analyser;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  iVar3 = (*(node->super_CallNode).super_ExpressionNode.super_Node._vptr_Node[3])(node);
  plVar1 = *(long **)CONCAT44(extraout_var,iVar3);
  plVar4 = (long *)plVar1[2];
  (**(code **)(*plVar4 + 0x10))(plVar4,this);
  pVVar2 = (this->value_)._M_t.super___uniq_ptr_impl<Value,_std::default_delete<Value>_>._M_t.
           super__Tuple_impl<0UL,_Value_*,_std::default_delete<Value>_>.
           super__Head_base<0UL,_Value_*,_false>._M_head_impl;
  if (pVVar2->valueType_ != F32) {
    __rhs = std::__detail::
            _Map_base<TypeName,_std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<TypeName>,_std::hash<TypeName>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::at((_Map_base<TypeName,_std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<TypeName>,_std::hash<TypeName>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  *)&TypeNameStrings_abi_cxx11_,&pVVar2->valueType_);
    std::operator+(&local_40,"Function if expected logical expression, but got ",__rhs);
    std::operator+(&local_60,&local_40,"!");
    reportError(&local_60,(Node *)node);
  }
  local_60._M_dataplus._M_p = (pointer)&PTR__ValueVisitor_00149c88;
  local_60._M_string_length._0_1_ = 0;
  local_60.field_2._M_local_buf[8] = '\0';
  (*pVVar2->_vptr_Value[3])(pVVar2);
  if (local_60.field_2._M_local_buf[8] != '\0') {
    plVar4 = (long *)CONCAT44(extraout_var,iVar3) + 1;
    if (0.0001 < ABS((double)local_60.field_2._M_allocated_capacity)) {
      plVar4 = plVar1;
    }
    (**(code **)(**(long **)(*plVar4 + 0x10) + 0x10))(*(long **)(*plVar4 + 0x10),this);
    return;
  }
  std::__throw_bad_optional_access();
}

Assistant:

void Executor::handleIf(const FunctionCallNode& node)
{
  const auto& args = node.getArguments();
  auto it = args.begin();
  (*it)->accept(*this);

  if(value_->getType() != TypeName::F32)
    reportError("Function if expected logical expression, but got " +
                TypeNameStrings.at(value_->getType()) + "!", node);

  NumberValueAnalyser analyser{};
  value_->accept(analyser);
  const auto condition = analyser.getValue().value();

  if(std::fabs(condition) > 0.0001)
  {
    it++;
    (*it)->accept(*this);
  }
  else
  {
    args.back()->accept(*this);
  }
}